

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O0

tuple<double,_double> __thiscall
Trainer::Trainer<Kuhn::Game>::outcomeSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,int iteration,double pi,double po,
          double s)

{
  long lVar1;
  Trainer<Kuhn::Game> *__args;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar2;
  int iVar3;
  Game *obj;
  bool bVar4;
  uint actionNum_00;
  int iVar5;
  double *strategy_00;
  __tuple_element_t<0UL,_tuple<double,_double>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<double,_double>_> *p_Var7;
  double *__wbegin;
  undefined4 in_register_00000014;
  double dVar8;
  double po_00;
  _Tuple_impl<1UL,_double> _Var9;
  _Head_base<0UL,_double,_false> _Var10;
  double s_00;
  _Tuple_impl<0UL,_double,_double> _Var11;
  tuple<double,_double> tVar12;
  undefined1 *puStack_240;
  double local_238 [4];
  double local_218;
  double local_210;
  result_type local_204;
  double *local_200;
  double *local_1f8;
  Node *local_1f0;
  mapped_type *local_1e8;
  Node *local_1e0;
  mapped_type *local_1d8;
  undefined1 local_1c9;
  int local_1c8;
  uint local_1c4;
  Trainer<Kuhn::Game> *local_1c0;
  Trainer<Kuhn::Game> *local_1b8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_1b0;
  double local_1a8;
  double local_1a0;
  double regretSum;
  double regret;
  double dStack_188;
  int a_2;
  double W;
  tuple<double,_double> ret;
  double newPo;
  double newPi;
  Game game_cp;
  double pTail;
  double util;
  undefined1 local_e8 [4];
  int action;
  discrete_distribution<int> dist;
  int a_1;
  int a;
  unsigned_long __vla_expr0;
  double epsilon;
  double *strategy;
  Node *node;
  int player;
  undefined1 local_70 [4];
  int actionNum;
  string infoSet;
  double local_48;
  double local_40;
  double s_local;
  double po_local;
  double pi_local;
  int iteration_local;
  int playerIndex_local;
  Game *game_local;
  Trainer<Kuhn::Game> *this_local;
  
  _iteration_local = (Game *)CONCAT44(in_register_00000014,playerIndex);
  *(long *)&game[0x34].mTurnNum = *(long *)&game[0x34].mTurnNum + 1;
  puStack_240 = (undefined1 *)0x1279a4;
  local_1c0 = this;
  local_1b8 = this;
  local_1b0 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *)game;
  local_40 = s;
  s_local = po;
  po_local = pi;
  pi_local._4_4_ = iteration;
  game_local = game;
  this_local = this;
  bVar4 = Kuhn::Game::done(_iteration_local);
  if (bVar4) {
    puStack_240 = (undefined1 *)0x1279b6;
    local_48 = Kuhn::Game::payoff(_iteration_local,pi_local._4_4_);
    local_48 = local_48 / local_40;
    infoSet.field_2._8_8_ = 0x3ff0000000000000;
    puStack_240 = (undefined1 *)0x1279e1;
    _Var11 = (_Tuple_impl<0UL,_double,_double>)
             std::make_tuple<double,double>((double *)local_1c0,&local_48);
  }
  else {
    puStack_240 = (undefined1 *)0x1279f3;
    Kuhn::Game::infoSetStr_abi_cxx11_((string *)local_70,_iteration_local);
    puStack_240 = (undefined1 *)0x1279fc;
    actionNum_00 = Kuhn::Game::actionNum(_iteration_local);
    puStack_240 = (undefined1 *)0x127a16;
    local_1c4 = actionNum_00;
    iVar5 = Kuhn::Game::currentPlayer(_iteration_local);
    local_1c9 = (*(byte *)(local_1b0[1]._M_x[0xf] + (long)iVar5) & 1) != 0;
    local_1c8 = iVar5;
    if (!(bool)local_1c9) {
      puStack_240 = &LAB_00127a7e;
      __assert_fail("mUpdate[player] && \"Outcome sampling with stochastically-weighted averaging cannot treat static player.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/bakanaouji[P]cpp-cfr/RegretMinimization/Trainer/Trainer.cpp"
                    ,0x224,
                    "std::tuple<double, double> Trainer::Trainer<Kuhn::Game>::outcomeSamplingCFR(const T &, const int, const int, const double, const double, const double) [T = Kuhn::Game]"
                   );
    }
    puStack_240 = (undefined1 *)0x127aa6;
    local_1d8 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                              *)(local_1b0 + 1),(key_type *)local_70);
    strategy = (double *)*local_1d8;
    if ((mapped_type)strategy == (mapped_type)0x0) {
      puStack_240 = (undefined1 *)0x127ad8;
      local_1e0 = (Node *)operator_new(0x30);
      puStack_240 = (undefined1 *)0x127af0;
      Node::Node(local_1e0,actionNum_00);
      strategy = (double *)local_1e0;
      local_1f0 = local_1e0;
      puStack_240 = (undefined1 *)0x127b25;
      local_1e8 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                                *)(local_1b0 + 1),(key_type *)local_70);
      *local_1e8 = local_1f0;
    }
    puStack_240 = (undefined1 *)0x127b6f;
    Node::updateStrategy((Node *)strategy);
    puStack_240 = (undefined1 *)0x127b7d;
    strategy_00 = Node::strategy((Node *)strategy);
    lVar1 = -((ulong)actionNum_00 * 8 + 0xf & 0xfffffffffffffff0);
    __wbegin = (double *)((long)local_238 + lVar1);
    if (iVar5 == pi_local._4_4_) {
      for (dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < (int)actionNum_00;
          dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        __wbegin[dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_] =
             strategy_00
             [dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_] * 0.4 +
             0.6 / (double)(int)actionNum_00;
      }
    }
    else {
      for (dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (int)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage < (int)actionNum_00;
          dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1) {
        __wbegin[(int)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage] =
             strategy_00
             [(int)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage];
      }
    }
    local_200 = __wbegin;
    local_1f8 = strategy_00;
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127cb5;
    std::discrete_distribution<int>::discrete_distribution<double*>
              ((discrete_distribution<int> *)local_e8,__wbegin,__wbegin + (int)actionNum_00);
    pmVar2 = local_1b0;
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127cca;
    local_204 = std::discrete_distribution<int>::operator()
                          ((discrete_distribution<int> *)local_e8,pmVar2);
    obj = _iteration_local;
    util._4_4_ = local_204;
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127cee;
    Kuhn::Game::Game((Game *)&newPi,obj);
    iVar3 = util._4_4_;
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127d02;
    Kuhn::Game::step((Game *)&newPi,iVar3);
    iVar3 = pi_local._4_4_;
    pmVar2 = local_1b0;
    local_210 = po_local;
    if (iVar5 == pi_local._4_4_) {
      local_218 = strategy_00[util._4_4_];
    }
    else {
      local_218 = 1.0;
    }
    dVar8 = po_local * local_218;
    local_238[3] = s_local;
    if (iVar5 == pi_local._4_4_) {
      local_238[2] = 1.0;
    }
    else {
      local_238[2] = strategy_00[util._4_4_];
    }
    po_00 = s_local * local_238[2];
    s_00 = local_40 * local_200[util._4_4_];
    ret.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
         po_00;
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127e0f;
    outcomeSamplingCFR((Trainer<Kuhn::Game> *)&W,(Game *)pmVar2,(int)&newPi,iVar3,dVar8,po_00,s_00);
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127e1d;
    p_Var6 = std::get<0ul,double,double>((tuple<double,_double> *)&W);
    pTail = *p_Var6;
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127e35;
    p_Var7 = std::get<1ul,double,double>((tuple<double,_double> *)&W);
    game_cp._88_8_ = *p_Var7;
    if (iVar5 == pi_local._4_4_) {
      dStack_188 = pTail * s_local;
      for (regret._4_4_ = 0; iVar5 = regret._4_4_, regret._4_4_ < (int)actionNum_00;
          regret._4_4_ = regret._4_4_ + 1) {
        if (regret._4_4_ == util._4_4_) {
          local_238[1] = dStack_188 * (1.0 - strategy_00[util._4_4_]) * (double)game_cp._88_8_;
        }
        else {
          local_238[1] = -dStack_188 * (double)game_cp._88_8_ * strategy_00[util._4_4_];
        }
        regretSum = local_238[1];
        *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127f26;
        local_238[0] = Node::regretSum((Node *)strategy,iVar5);
        iVar5 = regret._4_4_;
        dVar8 = local_238[0] + regretSum;
        local_1a0 = dVar8;
        *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127f66;
        Node::regretSum((Node *)strategy,iVar5,dVar8);
      }
    }
    else {
      dVar8 = s_local / local_40;
      *(undefined8 *)((long)&puStack_240 + lVar1) = 0x127fbe;
      Node::strategySum((Node *)strategy,strategy_00,dVar8);
    }
    __args = local_1c0;
    local_1a8 = (double)game_cp._88_8_ * strategy_00[util._4_4_];
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x128003;
    tVar12 = std::make_tuple<double&,double>((double *)__args,&pTail);
    _Var10 = tVar12.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>.
             _M_head_impl;
    *(undefined8 *)((long)&puStack_240 + lVar1) = 0x128011;
    std::discrete_distribution<int>::~discrete_distribution((discrete_distribution<int> *)local_e8);
    puStack_240 = (undefined1 *)0x128024;
    _Var9.super__Head_base<1UL,_double,_false>._M_head_impl =
         (_Head_base<1UL,_double,_false>)std::__cxx11::string::~string((string *)local_70);
    _Var11.super__Head_base<0UL,_double,_false>._M_head_impl = _Var10._M_head_impl;
    _Var11.super__Tuple_impl<1UL,_double>.super__Head_base<1UL,_double,_false>._M_head_impl =
         _Var9.super__Head_base<1UL,_double,_false>._M_head_impl;
  }
  return (tuple<double,_double>)_Var11;
}

Assistant:

std::tuple<double, double> Trainer<T>::outcomeSamplingCFR(const T &game, const int playerIndex, const int iteration , const double pi, const double po, const double s) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return std::make_tuple(game.payoff(playerIndex) / s, 1.0);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // outcome sampling with stochastically-weighted averaging cannot treat static player
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    assert(mUpdate[player] && "Outcome sampling with stochastically-weighted averaging cannot treat static player.");

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    node->updateStrategy();
    const double *strategy = node->strategy();

    // if current player is the target player, sample a single action according to epsilon-on-policy
    // otherwise, sample a single action according to the player's strategy
    const double epsilon = 0.6;
    double probability[actionNum];
    if (player == playerIndex) {
        for (int a = 0; a < actionNum; ++a) {
            probability[a] = (epsilon / (double) actionNum) + (1.0 - epsilon) * strategy[a];
        }
    } else {
        for (int a = 0; a < actionNum; ++a) {
            probability[a] = strategy[a];
        }
    }
    std::discrete_distribution<int> dist(probability, probability + actionNum);
    const int action = dist(mEngine);

    // for sampled action, recursively call cfr with additional history and probability
    double util, pTail;
    auto game_cp(game);
    game_cp.step(action);
    const double newPi = pi * (player == playerIndex ? strategy[action] : 1.0);
    const double newPo = po * (player == playerIndex ? 1.0 : strategy[action]);
    std::tuple<double, double> ret = outcomeSamplingCFR(game_cp, playerIndex, iteration, newPi, newPo, s * probability[action]);
    util = std::get<0>(ret);
    pTail = std::get<1>(ret);
    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        const double W = util * po;
        for (int a = 0; a < actionNum; ++a) {
            const double regret = a == action ? W * (1.0 - strategy[action]) * pTail : -W * pTail * strategy[action];
            const double regretSum = node->regretSum(a) + regret;
            node->regretSum(a, regretSum);
        }
    } else {
        // update average strategy
        node->strategySum(strategy, po / s);
    }
    return std::make_tuple(util, pTail * strategy[action]);
}